

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcElementComponent::IfcElementComponent(IfcElementComponent *this)

{
  *(undefined ***)&(this->super_IfcElement).field_0x148 = &PTR__Object_007631c0;
  *(undefined8 *)&this->field_0x150 = 0;
  *(char **)&this->field_0x158 = "IfcElementComponent";
  IfcElement::IfcElement(&this->super_IfcElement,&PTR_construction_vtable_24__007a4a20);
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject = 0x7a4918;
  *(undefined8 *)&(this->super_IfcElement).field_0x148 = 0x7a4a08;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0x88 = 0x7a4940;
  (this->super_IfcElement).super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x7a4968;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0xd0 = 0x7a4990;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.field_0x100 = 0x7a49b8;
  *(undefined8 *)&(this->super_IfcElement).field_0x138 = 0x7a49e0;
  return;
}

Assistant:

IfcElementComponent() : Object("IfcElementComponent") {}